

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-itr.c
# Opt level: O0

rtosc_arg_val_t * rtosc_arg_val_itr_get(rtosc_arg_val_itr *itr,rtosc_arg_val_t *buffer)

{
  long lVar1;
  int32_t iVar2;
  rtosc_arg_val_t *in_RSI;
  long *in_RDI;
  rtosc_arg_val_t *result;
  rtosc_arg_val_t *in_stack_00000020;
  int in_stack_0000002c;
  rtosc_arg_val_t *in_stack_00000030;
  rtosc_arg_val_t *local_18;
  
  if (*(char *)*in_RDI == '-') {
    iVar2 = rtosc_av_rep_has_delta((rtosc_arg_val_t *)0x12576b);
    local_18 = in_RSI;
    if (iVar2 == 0) {
      lVar1 = *in_RDI;
      *(undefined8 *)in_RSI = *(undefined8 *)(lVar1 + 0x18);
      (in_RSI->val).d = *(double *)(lVar1 + 0x20);
      (in_RSI->val).b.data = *(uint8_t **)(lVar1 + 0x28);
    }
    else {
      rtosc_arg_val_range_arg(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
    }
  }
  else {
    local_18 = (rtosc_arg_val_t *)*in_RDI;
  }
  return local_18;
}

Assistant:

const rtosc_arg_val_t* rtosc_arg_val_itr_get(const rtosc_arg_val_itr *itr,
                                             rtosc_arg_val_t* buffer)
{
    const rtosc_arg_val_t* result;
    if(itr->av->type == '-')
    {
        if(rtosc_av_rep_has_delta(itr->av))
            rtosc_arg_val_range_arg(itr->av, itr->range_i, buffer);
        else
            *buffer = itr->av[1];
        result = buffer;
    }
    else result = itr->av;
    return result;
}